

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall Imath_2_5::Matrix33<double>::Matrix33(Matrix33<double> *this,double a)

{
  double a_local;
  Matrix33<double> *this_local;
  
  this->x[0][0] = a;
  this->x[0][1] = a;
  this->x[0][2] = a;
  this->x[1][0] = a;
  this->x[1][1] = a;
  this->x[1][2] = a;
  this->x[2][0] = a;
  this->x[2][1] = a;
  this->x[2][2] = a;
  return;
}

Assistant:

inline
Matrix33<T>::Matrix33 (T a)
{
    x[0][0] = a;
    x[0][1] = a;
    x[0][2] = a;
    x[1][0] = a;
    x[1][1] = a;
    x[1][2] = a;
    x[2][0] = a;
    x[2][1] = a;
    x[2][2] = a;
}